

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::AnalyzeBtree
          (CordRepAnalyzer *this,RepRef rep)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  CordzStatistics *pCVar4;
  CordRep *pCVar5;
  CordRepBtree *pCVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  undefined1 auVar10 [16];
  RepRef rep_00;
  RepRef rep_01;
  
  sVar7 = rep.refcount;
  pCVar4 = this->statistics_;
  psVar1 = &pCVar4->node_count;
  *psVar1 = *psVar1 + 1;
  psVar1 = &(pCVar4->node_counts).btree;
  *psVar1 = *psVar1 + 1;
  (this->memory_usage_).total = (this->memory_usage_).total + 0x40;
  auVar10._8_4_ = rep.refcount._4_4_;
  auVar10._0_8_ = sVar7;
  auVar10._12_4_ = 0x45300000;
  (this->memory_usage_).fair_share =
       64.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)rep.refcount) - 4503599627370496.0)) +
       (this->memory_usage_).fair_share;
  pCVar6 = CordRep::btree(rep.rep);
  bVar2 = (pCVar6->super_CordRep).storage[1];
  bVar3 = (pCVar6->super_CordRep).storage[2];
  if ((pCVar6->super_CordRep).storage[0] == '\0') {
    for (lVar9 = (ulong)bVar2 << 3; (ulong)bVar3 * 8 != lVar9; lVar9 = lVar9 + 8) {
      pCVar5 = *(CordRep **)((long)pCVar6->edges_ + lVar9);
      if (pCVar5 == (CordRep *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (long)((pCVar5->refcount).count_.super___atomic_base<int>._M_i >> 1) * sVar7;
      }
      rep_01.refcount = sVar8;
      rep_01.rep = pCVar5;
      CountLinearReps(this,rep_01,&this->memory_usage_);
    }
  }
  else {
    for (lVar9 = (ulong)bVar2 << 3; (ulong)bVar3 * 8 != lVar9; lVar9 = lVar9 + 8) {
      pCVar5 = *(CordRep **)((long)pCVar6->edges_ + lVar9);
      if (pCVar5 == (CordRep *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (long)((pCVar5->refcount).count_.super___atomic_base<int>._M_i >> 1) * sVar7;
      }
      rep_00.refcount = sVar8;
      rep_00.rep = pCVar5;
      AnalyzeBtree(this,rep_00);
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(RepRef rep) {
    statistics_.node_count++;
    statistics_.node_counts.btree++;
    memory_usage_.Add(sizeof(CordRepBtree), rep.refcount);
    const CordRepBtree* tree = rep.rep->btree();
    if (tree->height() > 0) {
      for (CordRep* edge : tree->Edges()) {
        AnalyzeBtree(rep.Child(edge));
      }
    } else {
      for (CordRep* edge : tree->Edges()) {
        CountLinearReps(rep.Child(edge), memory_usage_);
      }
    }
  }